

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody
          (MessageGenerator *this,Printer *printer,bool to_array)

{
  int iVar1;
  int iVar2;
  ExtensionRange *pEVar3;
  ExtensionRange *pEVar4;
  FieldDescriptor *field;
  iterator iVar5;
  undefined4 uVar6;
  Descriptor *pDVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ExtensionRange **ppEVar12;
  FieldDescriptor *field_00;
  char *pcVar13;
  MessageGenerator *this_00;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  ExtensionRange **ppEVar14;
  long lVar15;
  Printer *this_01;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  LazySerializerEmitter e;
  ExtensionRange **local_a8;
  iterator iStack_a0;
  ExtensionRange **local_98;
  Printer *local_90;
  undefined4 local_84;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_80;
  undefined1 local_68 [17];
  bool local_57;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  int local_38;
  
  local_90 = printer;
  anon_unknown_0::SortFieldsByNumber(&local_80,this->descriptor_);
  local_a8 = (ExtensionRange **)0x0;
  iStack_a0._M_current = (ExtensionRange **)0x0;
  local_98 = (ExtensionRange **)0x0;
  pDVar7 = this->descriptor_;
  if (0 < *(int *)(pDVar7 + 0x68)) {
    lVar9 = 0;
    lVar15 = 0;
    do {
      local_68._0_8_ = *(long *)(pDVar7 + 0x70) + lVar9;
      if (iStack_a0._M_current == local_98) {
        std::
        vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor::ExtensionRange_const*>
                  ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                    *)&local_a8,iStack_a0,(ExtensionRange **)local_68);
      }
      else {
        *iStack_a0._M_current = (ExtensionRange *)local_68._0_8_;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
      lVar15 = lVar15 + 1;
      pDVar7 = this->descriptor_;
      lVar9 = lVar9 + 8;
    } while (lVar15 < *(int *)(pDVar7 + 0x68));
  }
  iVar5._M_current = iStack_a0._M_current;
  ppEVar12 = local_a8;
  if (local_a8 != iStack_a0._M_current) {
    lVar15 = (long)iStack_a0._M_current - (long)local_a8;
    uVar8 = lVar15 >> 3;
    lVar9 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
              (local_a8,iStack_a0._M_current,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                (ppEVar12,iVar5._M_current);
    }
    else {
      ppEVar14 = ppEVar12 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                (ppEVar12,ppEVar14);
      for (; ppEVar14 != iVar5._M_current; ppEVar14 = ppEVar14 + 1) {
        pEVar3 = ppEVar14[-1];
        pEVar4 = *ppEVar14;
        iVar2 = pEVar4->start;
        iVar1 = pEVar3->start;
        ppEVar12 = ppEVar14;
        while (iVar2 < iVar1) {
          *ppEVar12 = pEVar3;
          pEVar3 = ppEVar12[-2];
          ppEVar12 = ppEVar12 + -1;
          iVar1 = pEVar3->start;
        }
        *ppEVar12 = pEVar4;
      }
    }
  }
  this_01 = local_90;
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(local_90,
                       "::google::protobuf::internal::WeakFieldMap::FieldWriter field_writer(_weak_field_map_);\n"
                      );
  }
  io::Printer::Print(this_01,
                     "::google::protobuf::uint32 cached_has_bits = 0;\n(void) cached_has_bits;\n\n")
  ;
  local_68._8_8_ = this_01;
  local_57 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3;
  local_50._M_allocated_capacity = 0;
  local_50._8_8_ = 0;
  local_40._M_p = (pointer)0x0;
  local_38 = -1;
  field_00 = (FieldDescriptor *)0x0;
  local_84 = (undefined4)CONCAT71(in_register_00000011,to_array);
  uVar10 = 0;
  uVar8 = 0;
  local_68._0_8_ = this;
  local_68[0x10] = to_array;
  do {
    uVar11 = (ulong)uVar10;
    uVar8 = (ulong)(int)uVar8;
    while( true ) {
      if (((ulong)((long)local_80.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar11) &&
         ((ulong)((long)iStack_a0._M_current - (long)local_a8 >> 3) <= uVar8)) {
        if (field_00 != (FieldDescriptor *)0x0) {
          GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
          LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__(local_68,field_00);
        }
        GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::~LazySerializerEmitter
                  ((LazySerializerEmitter *)local_68);
        uVar6 = local_84;
        if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
          pcVar13 = 
          "output->WriteRaw(unknown_fields().data(),\n                 static_cast<int>(unknown_fields().size()));\n"
          ;
          if (((this->options_).enforce_lite == false) &&
             (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
            io::Printer::Print(this_01,"if (_internal_metadata_.have_unknown_fields()) {\n");
            io::Printer::Indent(this_01);
            pcVar13 = 
            "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n    unknown_fields(), output);\n"
            ;
            if ((char)uVar6 != '\0') {
              pcVar13 = 
              "target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n    unknown_fields(), target);\n"
              ;
            }
            io::Printer::Print(this_01,pcVar13);
            io::Printer::Outdent(this_01);
            pcVar13 = "}\n";
          }
          io::Printer::Print(this_01,pcVar13);
        }
        if (local_a8 != (ExtensionRange **)0x0) {
          operator_delete(local_a8,(long)local_98 - (long)local_a8);
        }
        if (local_80.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      if ((uVar8 == (long)iStack_a0._M_current - (long)local_a8 >> 3) ||
         (((int)uVar10 < *(int *)(this->descriptor_ + 0x2c) &&
          (*(int *)(local_80.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11] + 0x38) <
           local_a8[uVar8]->start)))) break;
      if (field_00 != (FieldDescriptor *)0x0) {
        GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
        LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
                  ((MessageGenerator *)local_68,field_00);
      }
      this_00 = (MessageGenerator *)local_68;
      GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
                ((LazySerializerEmitter *)local_68);
      ppEVar12 = local_a8 + uVar8;
      uVar8 = uVar8 + 1;
      GenerateSerializeOneExtensionRange(this_00,this_01,*ppEVar12,to_array);
      field_00 = (FieldDescriptor *)0x0;
    }
    field = local_80.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar11];
    if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\x01') {
      anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(local_90,field);
      field_00 = field;
    }
    else {
      if (field_00 != (FieldDescriptor *)0x0) {
        GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
        LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
                  ((MessageGenerator *)local_68,field_00);
      }
      GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
      LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
                ((MessageGenerator *)local_68,field);
      field_00 = (FieldDescriptor *)0x0;
    }
    uVar10 = uVar10 + 1;
    this_01 = local_90;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesBody(io::Printer* printer, bool to_array) {
  // If there are multiple fields in a row from the same oneof then we
  // coalesce them and emit a switch statement.  This is more efficient
  // because it lets the C++ compiler know this is a "at most one can happen"
  // situation. If we emitted "if (has_x()) ...; if (has_y()) ..." the C++
  // compiler's emitted code might check has_y() even when has_x() is true.
  class LazySerializerEmitter {
   public:
    LazySerializerEmitter(MessageGenerator* mg, io::Printer* printer,
                          bool to_array)
        : mg_(mg),
          printer_(printer),
          to_array_(to_array),
          eager_(!HasFieldPresence(mg->descriptor_->file())),
          cached_has_bit_index_(-1) {}

    ~LazySerializerEmitter() { Flush(); }

    // If conditions allow, try to accumulate a run of fields from the same
    // oneof, and handle them at the next Flush().
    void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            printer_->Print(
                "cached_has_bits = _has_bits_[$new_index$];\n",
                "new_index", SimpleItoa(new_index));

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(
            printer_, field, to_array_, cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }

    void Flush() {
      if (!v_.empty()) {
        mg_->GenerateSerializeOneofFields(printer_, v_, to_array_);
        v_.clear();
      }
    }

   private:
    // If we have multiple fields in v_ then they all must be from the same
    // oneof.  Would adding field to v_ break that invariant?
    bool MustFlush(const FieldDescriptor* field) {
      return !v_.empty() &&
             v_[0]->containing_oneof() != field->containing_oneof();
    }

    MessageGenerator* mg_;
    io::Printer* printer_;
    const bool to_array_;
    const bool eager_;
    std::vector<const FieldDescriptor*> v_;

    // cached_has_bit_index_ maintains that:
    //   cached_has_bits = from._has_bits_[cached_has_bit_index_]
    // for cached_has_bit_index_ >= 0
    int cached_has_bit_index_;
  };

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  if (num_weak_fields_) {
    printer->Print(
        "::google::protobuf::internal::WeakFieldMap::FieldWriter field_writer("
        "_weak_field_map_);\n");
  }

  printer->Print(
      "::google::protobuf::uint32 cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  // Merge the fields and the extension ranges, both sorted by field number.
  {
    LazySerializerEmitter e(this, printer, to_array);
    const FieldDescriptor* last_weak_field = NULL;
    int i, j;
    for (i = 0, j = 0;
         i < ordered_fields.size() || j < sorted_extensions.size();) {
      if ((j == sorted_extensions.size()) ||
          (i < descriptor_->field_count() &&
           ordered_fields[i]->number() < sorted_extensions[j]->start)) {
        const FieldDescriptor* field = ordered_fields[i++];
        if (field->options().weak()) {
          last_weak_field = field;
          PrintFieldComment(printer, field);
        } else {
          if (last_weak_field != NULL) {
            e.Emit(last_weak_field);
            last_weak_field = NULL;
          }
          e.Emit(field);
        }
      } else  {
        if (last_weak_field != NULL) {
          e.Emit(last_weak_field);
          last_weak_field = NULL;
        }
        e.Flush();
        GenerateSerializeOneExtensionRange(printer,
                                           sorted_extensions[j++],
                                           to_array);
      }
    }
    if (last_weak_field != NULL) {
      e.Emit(last_weak_field);
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print("if (_internal_metadata_.have_unknown_fields()) {\n");
      printer->Indent();
      if (to_array) {
        printer->Print(
          "target = "
              "::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n"
          "    unknown_fields(), target);\n");
      } else {
        printer->Print(
          "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n"
          "    unknown_fields(), output);\n");
      }
      printer->Outdent();

      printer->Print(
        "}\n");
    } else {
      printer->Print(
        "output->WriteRaw(unknown_fields().data(),\n"
        "                 static_cast<int>(unknown_fields().size()));\n");
    }
  }
}